

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktau.hpp
# Opt level: O2

double wdm::impl::ktau(vector<double,_std::allocator<double>_> *x,
                      vector<double,_std::allocator<double>_> *y,
                      vector<double,_std::allocator<double>_> *weights)

{
  double dVar1;
  double dVar2;
  allocator_type local_59;
  double local_58;
  double local_50;
  double local_48;
  double num_d;
  value_type_conflict local_38;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  utils::check_sizes(x,y,weights);
  utils::sort_all(x,y,weights);
  local_58 = utils::count_tied_pairs(x,weights);
  local_48 = utils::count_joint_ties(x,y,weights);
  num_d = 0.0;
  utils::merge_sort(y,weights,&num_d);
  local_50 = utils::count_tied_pairs(y,weights);
  if ((weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_finish ==
      (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start) {
    local_38 = 1.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_30,
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3,&local_38,&local_59);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(weights,&local_30);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  }
  dVar1 = utils::perm_sum(weights,2);
  dVar2 = dVar1 - local_58;
  local_58 = (dVar1 - ((local_58 + num_d + local_50) - local_48)) - num_d;
  dVar2 = (dVar1 - local_50) * dVar2;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  return local_58 / dVar2;
}

Assistant:

inline double ktau(std::vector<double> x,
                   std::vector<double> y,
                   std::vector<double> weights = std::vector<double>())
{
    utils::check_sizes(x, y, weights);

    // 1.1 Sort x, y, and weights in x order; break ties in according to y.
    utils::sort_all(x, y, weights);

    // 1.2 Count pairs of tied x and simultaneous ties in x and y.
    double ties_x = utils::count_tied_pairs(x, weights);
    double ties_both = utils::count_joint_ties(x, y, weights);

    // 2.1 Sort y again and count exchanges (= number of discordant pairs).
    double num_d = 0.0;
    utils::merge_sort(y, weights, num_d);

    // 2.2 Count pairs of tied y.
    double ties_y = utils::count_tied_pairs(y, weights);

    // 3. Calculate Kendall's tau.
    if (weights.size() == 0)
        weights = std::vector<double>(x.size(), 1.0);
    double num_pairs = utils::perm_sum(weights, 2);
    double num_c = num_pairs - (num_d + ties_x + ties_y - ties_both);
    double tau = num_c - num_d;
    tau /= std::sqrt((num_pairs - ties_x) * (num_pairs - ties_y));

    return tau;
}